

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshifter.cpp
# Opt level: O2

EffectState * __thiscall
anon_unknown.dwarf_162b95::FshifterStateFactory::create(FshifterStateFactory *this)

{
  EffectState *__s;
  undefined8 *puVar1;
  
  __s = (EffectState *)al_malloc(0x10,0x10150);
  if (__s != (EffectState *)0x0) {
    memset(__s,0,0xf050);
    (__s->super_intrusive_ref<EffectState>).mRef.super___atomic_base<unsigned_int>._M_i = 1;
    (__s->mOutTarget).mData = (pointer)0x0;
    (__s->mOutTarget).mDataEnd = (pointer)0x0;
    __s->_vptr_EffectState = (_func_int **)&PTR__EffectState_001abb78;
    memset(__s + 1,0,0xf028);
    memset(&__s[0x782].mOutTarget,0,0x1100);
    return __s;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = pthread_once;
  __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EffectState *create() override { return new FshifterState{}; }